

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall vera::Model::setGeom(Model *this,Mesh *_mesh)

{
  BoundingBox *_bbox;
  pointer pvVar1;
  Model *this_00;
  Vbo *pVVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  float fVar5;
  allocator local_10a;
  allocator local_109;
  string local_108;
  float local_e4;
  Mesh local_e0;
  Model *local_38;
  
  Mesh::operator=(&this->mesh,_mesh);
  pVVar2 = (Vbo *)operator_new(0x60);
  Vbo::Vbo(pVVar2,_mesh);
  this->m_model_vbo = pVVar2;
  _bbox = &this->m_bbox;
  (this->m_bbox).min.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x7f7fffff;
  (this->m_bbox).min.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x7f7fffff;
  *(undefined8 *)&(this->m_bbox).min.field_2 = 0x8000007f7fffff;
  (this->m_bbox).max.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x800000;
  (this->m_bbox).max.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x800000;
  lVar4 = 0;
  local_38 = this;
  for (uVar3 = 0;
      pvVar1 = (_mesh->m_vertices).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(_mesh->m_vertices).
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0xc);
      uVar3 = uVar3 + 1) {
    BoundingBox::expand(_bbox,(vec3 *)((long)&pvVar1->field_0 + lVar4));
    lVar4 = lVar4 + 0xc;
  }
  local_e4 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&_bbox->min);
  fVar5 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&(this->m_bbox).max)
  ;
  this_00 = local_38;
  if (local_e4 <= fVar5) {
    fVar5 = local_e4;
  }
  local_38->m_area = fVar5;
  pVVar2 = (Vbo *)operator_new(0x60);
  cubeCornersMesh(&local_e0,_bbox,0.25);
  Vbo::Vbo(pVVar2,&local_e0);
  this_00->m_bbox_vbo = pVVar2;
  Mesh::~Mesh(&local_e0);
  if ((_mesh->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_e0,"MODEL_VERTEX_COLOR",&local_109);
    std::__cxx11::string::string((string *)&local_108,"v_color",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((_mesh->m_normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_normals).
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_e0,"MODEL_VERTEX_NORMAL",&local_109);
    std::__cxx11::string::string((string *)&local_108,"v_normal",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((_mesh->m_texCoords).
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_texCoords).
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_e0,"MODEL_VERTEX_TEXCOORD",&local_109);
    std::__cxx11::string::string((string *)&local_108,"v_texcoord",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((_mesh->m_tangents).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_mesh->m_tangents).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_e0,"MODEL_VERTEX_TANGENT",&local_109);
    std::__cxx11::string::string((string *)&local_108,"v_tangent",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  switch(_mesh->m_drawMode) {
  case POINTS:
    std::__cxx11::string::string((string *)&local_e0,"MODEL_PRIMITIVE_POINTS",&local_109);
    std::__cxx11::string::string((string *)&local_108,"",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    break;
  case LINES:
    std::__cxx11::string::string((string *)&local_e0,"MODEL_PRIMITIVE_LINES",&local_109);
    std::__cxx11::string::string((string *)&local_108,"",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    break;
  case LINE_STRIP:
    std::__cxx11::string::string((string *)&local_e0,"MODEL_PRIMITIVE_LINE_STRIP",&local_109);
    std::__cxx11::string::string((string *)&local_108,"",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    break;
  case LINE_LOOP:
    std::__cxx11::string::string((string *)&local_e0,"MODEL_PRIMITIVE_LINE_LOOP",&local_109);
    std::__cxx11::string::string((string *)&local_108,"",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    break;
  case TRIANGLES:
    std::__cxx11::string::string((string *)&local_e0,"MODEL_PRIMITIVE_TRIANGLES",&local_109);
    std::__cxx11::string::string((string *)&local_108,"",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
    break;
  default:
    goto switchD_0024bba0_caseD_5;
  case TRIANGLE_FAN:
    std::__cxx11::string::string((string *)&local_e0,"MODEL_PRIMITIVE_TRIANGLE_FAN",&local_109);
    std::__cxx11::string::string((string *)&local_108,"",&local_10a);
    addDefine(this_00,(string *)&local_e0,&local_108);
  }
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
switchD_0024bba0_caseD_5:
  std::__cxx11::string::string((string *)&local_e0,"LIGHT_SHADOWMAP",&local_109);
  std::__cxx11::string::string((string *)&local_108,"u_lightShadowMap",&local_10a);
  addDefine(this_00,(string *)&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"LIGHT_SHADOWMAP_SIZE",&local_109);
  std::__cxx11::string::string((string *)&local_108,"2048.0",&local_10a);
  addDefine(this_00,(string *)&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  return true;
}

Assistant:

bool Model::setGeom(const Mesh& _mesh) {
    mesh = _mesh;

    // Load Geometry VBO
    m_model_vbo = new Vbo(_mesh);

    m_bbox.clean();
    for (size_t i = 0; i < _mesh.getVerticesTotal(); i++)
        m_bbox.expand( _mesh.getVertex(i) );

    m_area = glm::min(glm::length(m_bbox.min), glm::length(m_bbox.max));
    m_bbox_vbo = new Vbo( cubeCornersMesh( m_bbox, 0.25 ) );

    // Setup Shader and GEOMETRY DEFINE FLAGS
    if (_mesh.haveColors())
        addDefine("MODEL_VERTEX_COLOR", "v_color");

    if (_mesh.haveNormals())
        addDefine("MODEL_VERTEX_NORMAL", "v_normal");

    if (_mesh.haveTexCoords())
        addDefine("MODEL_VERTEX_TEXCOORD", "v_texcoord");

    if (_mesh.haveTangents())
        addDefine("MODEL_VERTEX_TANGENT", "v_tangent");

    if (_mesh.getDrawMode() == POINTS)
        addDefine("MODEL_PRIMITIVE_POINTS");
    else if (_mesh.getDrawMode() == LINES)
        addDefine("MODEL_PRIMITIVE_LINES");
    else if (_mesh.getDrawMode() == LINE_LOOP)
        addDefine("MODEL_PRIMITIVE_LINE_LOOP");
    else if (_mesh.getDrawMode() == LINE_STRIP)
        addDefine("MODEL_PRIMITIVE_LINE_STRIP");
    else if (_mesh.getDrawMode() == TRIANGLES)
        addDefine("MODEL_PRIMITIVE_TRIANGLES");
    else if (_mesh.getDrawMode() == TRIANGLE_FAN)
        addDefine("MODEL_PRIMITIVE_TRIANGLE_FAN");

    addDefine("LIGHT_SHADOWMAP", "u_lightShadowMap");
    addDefine("LIGHT_SHADOWMAP_SIZE", "2048.0");

    return true;
}